

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

int32_t __thiscall
wasm::WasmBinaryWriter::startSection<wasm::BinaryConsts::Section>
          (WasmBinaryWriter *this,Section code)

{
  int32_t iVar1;
  uchar local_11;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_11);
  if (this->sourceMap != (ostream *)0x0) {
    this->sourceMapLocationsSizeAtSectionStart =
         (long)(this->sourceMapLocations).
               super__Vector_base<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>,_std::allocator<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->sourceMapLocations).
               super__Vector_base<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>,_std::allocator<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 4;
  }
  this->binaryLocationsSizeAtSectionStart =
       (this->binaryLocations).expressions._M_h._M_element_count;
  iVar1 = writeU32LEBPlaceholder(this);
  return iVar1;
}

Assistant:

int32_t WasmBinaryWriter::startSection(T code) {
  o << uint8_t(code);
  if (sourceMap) {
    sourceMapLocationsSizeAtSectionStart = sourceMapLocations.size();
  }
  binaryLocationsSizeAtSectionStart = binaryLocations.expressions.size();
  return writeU32LEBPlaceholder(); // section size to be filled in later
}